

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  undefined4 uVar6;
  
  uVar6 = *(undefined4 *)&info->field_0x34;
  (this->m_info).resultDisposition = info->resultDisposition;
  *(undefined4 *)&(this->m_info).field_0x34 = uVar6;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_info).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_info).capturedExpression.m_size = sVar5;
  (this->m_info).lineInfo.file = pcVar3;
  (this->m_info).lineInfo.line = sVar4;
  (this->m_info).macroName.m_start = pcVar1;
  (this->m_info).macroName.m_size = sVar2;
  AssertionResultData::AssertionResultData(&this->m_resultData,data);
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}